

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

size_t phosg::fread_abi_cxx11_(void *__ptr,size_t __size,size_t __n,FILE *__stream)

{
  int fd;
  char *__ptr_00;
  size_t __n_00;
  io_error *this;
  ssize_t ret_size;
  allocator<char> local_22;
  undefined1 local_21;
  size_t local_20;
  size_t size_local;
  FILE *f_local;
  string *data;
  
  local_21 = 0;
  local_20 = __n;
  size_local = __size;
  f_local = (FILE *)__ptr;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__ptr,__n,'\0',&local_22);
  ::std::allocator<char>::~allocator(&local_22);
  __ptr_00 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr);
  __n_00 = ::fread(__ptr_00,1,local_20,(FILE *)size_local);
  if (-1 < (long)__n_00) {
    if (__n_00 != local_20) {
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__ptr,__n_00);
    }
    return (size_t)__ptr;
  }
  this = (io_error *)__cxa_allocate_exception(0x20);
  fd = fileno((FILE *)size_local);
  io_error::io_error(this,fd);
  __cxa_throw(this,&io_error::typeinfo,io_error::~io_error);
}

Assistant:

string fread(FILE* f, size_t size) {
  string data(size, '\0');
  ssize_t ret_size = ::fread(data.data(), 1, size, f);
  if (ret_size < 0) {
    throw io_error(fileno(f));
  } else if (ret_size != static_cast<ssize_t>(size)) {
    data.resize(ret_size);
  }
  return data;
}